

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

int __thiscall luna::Lexer::LexSingleLineString(Lexer *this,TokenDetail *detail)

{
  int iVar1;
  int iVar2;
  String *pSVar3;
  LexException *this_00;
  anon_union_16_2_eed97686_for_String_2 *paVar4;
  
  iVar2 = this->current_;
  iVar1 = Next(this);
  this->current_ = iVar1;
  (this->token_buffer_)._M_string_length = 0;
  *(this->token_buffer_)._M_dataplus._M_p = '\0';
  while( true ) {
    iVar1 = this->current_;
    if (iVar1 == iVar2) {
      iVar2 = Next(this);
      this->current_ = iVar2;
      pSVar3 = State::GetString(this->state_,&this->token_buffer_);
      (detail->field_0).str_ = pSVar3;
      detail->token_ = 0x116;
      iVar2 = this->column_;
      detail->line_ = this->line_;
      detail->column_ = iVar2;
      detail->module_ = this->module_;
      return 0x116;
    }
    if ((iVar1 == 0xd) || (iVar1 == 10)) break;
    if (iVar1 == -1) {
      this_00 = (LexException *)__cxa_allocate_exception(0x20);
      pSVar3 = this->module_;
      if ((pSVar3->super_GCObject).field_0x11 == '\0') {
        paVar4 = &pSVar3->field_1;
      }
      else {
        paVar4 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar3->field_1).str_;
      }
      LexException::LexException<char_const(&)[27]>
                (this_00,paVar4->str_buffer_,this->line_,this->column_,
                 (char (*) [27])"incomplete string at <eof>");
      goto LAB_0013b6e0;
    }
    LexStringChar(this);
  }
  this_00 = (LexException *)__cxa_allocate_exception(0x20);
  pSVar3 = this->module_;
  if ((pSVar3->super_GCObject).field_0x11 == '\0') {
    paVar4 = &pSVar3->field_1;
  }
  else {
    paVar4 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar3->field_1).str_;
  }
  LexException::LexException<char_const(&)[31]>
            (this_00,paVar4->str_buffer_,this->line_,this->column_,
             (char (*) [31])"incomplete string at this line");
LAB_0013b6e0:
  __cxa_throw(this_00,&LexException::typeinfo,Exception::~Exception);
}

Assistant:

int Lexer::LexSingleLineString(TokenDetail *detail)
    {
        int quote = current_;
        current_ = Next();
        token_buffer_.clear();

        while (current_ != quote)
        {
            if (current_ == EOF)
                throw LexException(module_->GetCStr(), line_, column_,
                        "incomplete string at <eof>");

            if (current_ == '\r' || current_ == '\n')
                throw LexException(module_->GetCStr(), line_, column_,
                        "incomplete string at this line");

            LexStringChar();
        }

        current_ = Next();
        RETURN_TOKEN_DETAIL(detail, token_buffer_, Token_String);
    }